

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzio.cpp
# Opt level: O0

char * luaZ_openspace(lua_State *L,Mbuffer *buff,size_t n)

{
  char *local_28;
  size_t local_20;
  size_t n_local;
  Mbuffer *buff_local;
  lua_State *L_local;
  
  if (buff->buffsize < n) {
    local_20 = n;
    if (n < 0x20) {
      local_20 = 0x20;
    }
    if (local_20 + 1 < 0xfffffffffffffffe) {
      local_28 = (char *)luaM_realloc_(L,buff->buffer,buff->buffsize,local_20);
    }
    else {
      local_28 = (char *)luaM_toobig(L);
    }
    buff->buffer = local_28;
    buff->buffsize = local_20;
  }
  return buff->buffer;
}

Assistant:

char *luaZ_openspace (lua_State *L, Mbuffer *buff, size_t n) {
  if (n > buff->buffsize) {
    if (n < LUA_MINBUFFER) n = LUA_MINBUFFER;
    luaZ_resizebuffer(L, buff, n);
  }
  return buff->buffer;
}